

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O2

void clearAllBuffers(void)

{
  TA_Real (*paaTVar1) [4] [480];
  long lVar2;
  TA_Real (*paTVar3) [480];
  long lVar4;
  long lVar5;
  long lVar6;
  
  paaTVar1 = buf;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    lVar4 = 0;
    paTVar3 = *paaTVar1;
    for (; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar6 = 100, lVar5 != 100; lVar5 = lVar5 + 1) {
        (*(TA_Real (*) [480])*paTVar3)[lVar5] = 9.1349043e-200;
      }
      for (; lVar6 != 0x1e0; lVar6 = lVar6 + 1) {
        (*(TA_Real (*) [480])*paTVar3)[lVar6] = 8.1489031e-158;
      }
      paTVar3 = paTVar3 + 1;
    }
    paaTVar1 = (TA_Real (*) [4] [480])((long)paaTVar1 + 0x3c00);
  }
  return;
}

Assistant:

void clearAllBuffers( void )
{
   unsigned int i,j,k;

   for( i=0; i < NB_GLOBAL_BUFFER; i++ )
   {
      for( j=0; j < TA_NB_OUT_IN; j++ )
      {
         for( k=0; k < TA_BUF_PREFIX; k++ )
            buf[i][j][k] = RESV_PATTERN_PREFIX;
         for( ; k < TA_BUF_SIZE; k++ )
            buf[i][j][k] = RESV_PATTERN_SUFFIX;
      }
   }
}